

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDisplayer.cpp
# Opt level: O3

void __thiscall TextDisplayer::drawCharacter(TextDisplayer *this,char character,GLint pixelSize)

{
  Character *pCVar1;
  bool **ppbVar2;
  int character_00;
  undefined7 in_register_00000031;
  int j;
  long lVar3;
  int i;
  long lVar4;
  float pixelSize_00;
  
  character_00 = (int)CONCAT71(in_register_00000031,character);
  pCVar1 = Alphabet::getChar(this->alphabet,character_00);
  if (pCVar1 != (Character *)0x0) {
    pCVar1 = Alphabet::getChar(this->alphabet,character_00);
    ppbVar2 = Character::getPixels(pCVar1);
    pixelSize_00 = (float)pixelSize;
    lVar4 = 0;
    do {
      lVar3 = 0;
      do {
        if (ppbVar2[lVar4][lVar3] == true) {
          PrimitiveDisplayer::drawSquare(this->primitiveDisplayer,pixelSize_00);
        }
        glTranslatef(0,pixelSize_00,0);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 7);
      glTranslatef(pixelSize_00,(float)(pixelSize * -7),0);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
  }
  return;
}

Assistant:

void TextDisplayer::drawCharacter(char character, GLint pixelSize) {
    float resetVal = -Alphabet::CHARACTER_HEIGHT * pixelSize;
    if (alphabet->getChar(character)) {
        bool** charValues = alphabet->getChar(character)->getPixels();
        for (int i=0; i<Alphabet::CHARACTER_WIDTH; i++) {
            for (int j=0; j<Alphabet::CHARACTER_HEIGHT; j++) {
                if (charValues[i][j]) {
                    primitiveDisplayer->drawSquare(pixelSize);
                }
                glTranslatef(0.0f, pixelSize, 0.0f);
            }
            glTranslatef(pixelSize, resetVal, 0.0f);
        }
    }
}